

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  ImVec2 pos_00;
  ImVec2 IVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  ImGuiID id;
  ImU32 IVar6;
  ImU32 IVar7;
  ImGuiWindow *pIVar8;
  ImDrawCornerFlags rounding_corners;
  ImGuiContext *g;
  uint uVar9;
  uint uVar10;
  float fVar11;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar12;
  float fVar13;
  bool hovered;
  bool held;
  ImRect frame_bb;
  char name [16];
  ImVec2 size_expected;
  ImRect r_outer;
  ImVec2 pos;
  ImRect total_bb;
  bool local_f5;
  uint local_f4;
  float local_f0;
  bool local_e9;
  ImRect local_e8;
  undefined1 local_d8 [16];
  ImVec2 local_c8 [2];
  uint local_b4;
  ImVec2 local_b0;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [24];
  char *local_70;
  char *local_68;
  ImVec2 local_60;
  ImRect local_58;
  ImVec2 local_48;
  ImRect local_40;
  
  pIVar3 = GImGui;
  uVar9 = (GImGui->NextWindowData).Flags;
  (GImGui->NextWindowData).Flags = uVar9 & 0xffffffef;
  pIVar8 = pIVar3->CurrentWindow;
  pIVar8->WriteAccessed = true;
  if (pIVar8->SkipItems == false) {
    local_68 = preview_value;
    if ((~flags & 0x60U) == 0) {
      __assert_fail("(flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui_widgets.cpp"
                    ,0x5ae,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
    }
    id = ImGuiWindow::GetID(pIVar8,label,(char *)0x0);
    local_f0 = 0.0;
    if ((flags & 0x20U) == 0) {
      local_f0 = GetFrameHeight();
    }
    IVar1 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_88._8_4_ = extraout_XMM0_Dc;
    local_88._0_4_ = IVar1.x;
    local_88._4_4_ = IVar1.y;
    local_88._12_4_ = extraout_XMM0_Dd;
    fVar11 = CalcItemWidth();
    uStack_a4 = 0;
    uStack_a0 = 0;
    uStack_9c = 0;
    local_a8 = local_f0;
    if ((flags & 0x40U) == 0) {
      local_a8 = fVar11;
      uStack_a4 = extraout_XMM0_Db;
      uStack_a0 = extraout_XMM0_Dc_00;
      uStack_9c = extraout_XMM0_Dd_00;
    }
    fVar11 = (pIVar3->Style).FramePadding.y;
    local_e8.Max.x = (pIVar8->DC).CursorPos.x + local_a8;
    fVar12 = fVar11 + fVar11 + (float)local_88._4_4_ + (pIVar8->DC).CursorPos.y;
    local_e8.Max.y = fVar12;
    local_e8.Min = (pIVar8->DC).CursorPos;
    fVar13 = 0.0;
    if (0.0 < (float)local_88._0_4_) {
      fVar13 = (pIVar3->Style).ItemInnerSpacing.x + (float)local_88._0_4_;
    }
    local_40.Max.y = fVar12 + 0.0;
    local_40.Max.x = fVar13 + local_e8.Max.x;
    local_f4 = flags;
    local_70 = label;
    local_40.Min = local_e8.Min;
    ItemSize(&local_40,fVar11);
    bVar4 = ItemAdd(&local_40,id,&local_e8);
    if (bVar4) {
      local_b4 = uVar9;
      bVar4 = ButtonBehavior(&local_e8,id,&local_f5,&local_e9,0);
      bVar5 = IsPopupOpen(id);
      IVar6 = GetColorU32(local_f5 + 7,1.0);
      local_d8 = ZEXT416((uint)local_e8.Min.x);
      local_98 = ZEXT416((uint)local_e8.Max.x);
      RenderNavHighlight(&local_e8,id,1);
      uVar9 = local_f4;
      uVar10 = -(uint)((float)local_98._0_4_ - local_f0 <= (float)local_d8._0_4_);
      local_d8._0_4_ = uVar10 & local_d8._0_4_ | ~uVar10 & (uint)((float)local_98._0_4_ - local_f0);
      local_d8._4_4_ = local_98._4_4_ & local_d8._4_4_;
      local_d8._8_4_ = local_98._8_4_ & local_d8._8_4_;
      local_d8._12_4_ = local_98._12_4_ & local_d8._12_4_;
      if ((local_f4 & 0x40) == 0) {
        local_c8[0].y = local_e8.Max.y;
        local_c8[0].x = (float)local_d8._0_4_;
        rounding_corners = 0xf;
        if ((local_f4 & 0x20) == 0) {
          rounding_corners = 5;
        }
        ImDrawList::AddRectFilled
                  (pIVar8->DrawList,&local_e8.Min,local_c8,IVar6,(pIVar3->Style).FrameRounding,
                   rounding_corners);
      }
      if ((uVar9 & 0x20) == 0) {
        IVar6 = GetColorU32(((byte)(local_f5 | bVar5) & 1) + 0x15,1.0);
        IVar7 = GetColorU32(0,1.0);
        local_98._0_4_ = IVar7;
        local_c8[0].y = local_e8.Min.y;
        local_c8[0].x = (float)local_d8._0_4_;
        ImDrawList::AddRectFilled
                  (pIVar8->DrawList,local_c8,&local_e8.Max,IVar6,(pIVar3->Style).FrameRounding,
                   (uint)(local_a8 <= local_f0) * 5 + 10);
        if ((local_f0 + (float)local_d8._0_4_) - (pIVar3->Style).FramePadding.x <= local_e8.Max.x) {
          fVar11 = (pIVar3->Style).FramePadding.y;
          IVar1.y = fVar11 + local_e8.Min.y;
          IVar1.x = (float)local_d8._0_4_ + fVar11;
          RenderArrow(pIVar8->DrawList,IVar1,local_98._0_4_,3,1.0);
        }
      }
      uVar9 = local_f4 & 0x40;
      RenderFrameBorder(local_e8.Min,local_e8.Max,(pIVar3->Style).FrameRounding);
      if (local_68 != (char *)0x0 && (char)(uVar9 >> 6) == '\0') {
        local_c8[0].y = local_e8.Min.y + (pIVar3->Style).FramePadding.y;
        local_c8[0].x = local_e8.Min.x + (pIVar3->Style).FramePadding.x;
        local_58.Min.y = local_e8.Max.y;
        local_58.Min.x = (float)local_d8._0_4_;
        local_b0.x = 0.0;
        local_b0.y = 0.0;
        RenderTextClipped(local_c8,&local_58.Min,local_68,(char *)0x0,(ImVec2 *)0x0,&local_b0,
                          (ImRect *)0x0);
      }
      uVar9 = local_b4;
      if (0.0 < (float)local_88._0_4_) {
        pos_00.y = local_e8.Min.y + (pIVar3->Style).FramePadding.y;
        pos_00.x = local_e8.Max.x + (pIVar3->Style).ItemInnerSpacing.x;
        RenderText(pos_00,local_70,(char *)0x0,true);
      }
      bVar2 = bVar5;
      if (!bVar4) {
        bVar2 = bVar5 || pIVar3->NavActivateId != id;
      }
      if (bVar2 == false) {
        if ((pIVar8->DC).NavLayerCurrent == ImGuiNavLayer_Main) {
          pIVar8->NavLastIds[0] = id;
        }
        OpenPopupEx(id);
        bVar5 = true;
      }
      if (bVar5 == false) {
        return false;
      }
      if ((uVar9 & 0x10) == 0) {
        uVar9 = local_f4 | 4;
        if ((local_f4 & 0x1e) != 0) {
          uVar9 = local_f4;
        }
        uVar10 = (uVar9 & 0x1e) - 1;
        if ((uVar9 & 0x1e ^ uVar10) <= uVar10) {
          __assert_fail("ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui_widgets.cpp"
                        ,0x5e8,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)"
                       );
        }
        uVar10 = 8;
        if (((uVar9 & 4) == 0) && (uVar10 = 4, (uVar9 & 2) == 0)) {
          uVar10 = -(uint)((uVar9 & 8) == 0) | 0x14;
        }
        local_c8[0].y = 0.0;
        local_c8[0].x = local_a8;
        if ((int)uVar10 < 1) {
          fVar11 = 3.4028235e+38;
        }
        else {
          fVar11 = (GImGui->Style).WindowPadding.y;
          fVar12 = (GImGui->Style).ItemSpacing.y;
          fVar11 = fVar11 + fVar11 + ((float)(int)uVar10 * (GImGui->FontSize + fVar12) - fVar12);
        }
        local_58.Min.y = fVar11;
        local_58.Min.x = 3.4028235e+38;
        SetNextWindowSizeConstraints(local_c8,&local_58.Min,(ImGuiSizeCallback)0x0,(void *)0x0);
      }
      else {
        *(byte *)&(pIVar3->NextWindowData).Flags = (byte)(pIVar3->NextWindowData).Flags | 0x10;
        fVar11 = (pIVar3->NextWindowData).SizeConstraintRect.Min.x;
        uVar9 = -(uint)(local_a8 <= fVar11);
        (pIVar3->NextWindowData).SizeConstraintRect.Min.x =
             (float)(~uVar9 & (uint)local_a8 | (uint)fVar11 & uVar9);
        uVar9 = local_f4;
      }
      ImFormatString((char *)local_c8,0x10,"##Combo_%02d",
                     (ulong)(uint)(pIVar3->BeginPopupStack).Size);
      pIVar8 = FindWindowByName((char *)local_c8);
      if ((pIVar8 != (ImGuiWindow *)0x0) && (pIVar8->WasActive == true)) {
        local_b0 = CalcWindowExpectedSize(pIVar8);
        if ((uVar9 & 1) != 0) {
          pIVar8->AutoPosLastDirection = 0;
        }
        local_58 = GetWindowAllowedExtentRect(pIVar8);
        local_60.y = local_e8.Max.y;
        local_60.x = local_e8.Min.x;
        local_48 = FindBestWindowPosForPopupEx
                             (&local_60,&local_b0,&pIVar8->AutoPosLastDirection,&local_58,&local_e8,
                              ImGuiPopupPositionPolicy_ComboBox);
        local_60.x = 0.0;
        local_60.y = 0.0;
        SetNextWindowPos(&local_48,0,&local_60);
      }
      local_58.Min.y = (pIVar3->Style).WindowPadding.y;
      local_58.Min.x = (pIVar3->Style).FramePadding.x;
      PushStyleVar(1,&local_58.Min);
      bVar4 = Begin((char *)local_c8,(bool *)0x0,0x4000147);
      PopStyleVar(1);
      if (bVar4) {
        return bVar5;
      }
      EndPopup();
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui_widgets.cpp"
                    ,0x609,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    bool has_window_size_constraint = (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint) != 0;
    g.NextWindowData.Flags &= ~ImGuiNextWindowDataFlags_HasSizeConstraint;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float expected_w = CalcItemWidth();
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : expected_w;
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id);

    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(frame_bb.Min.x, frame_bb.Max.x - arrow_size);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(value_x2, frame_bb.Max.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2, frame_bb.Min.y), frame_bb.Max, bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        if (value_x2 + arrow_size - style.FramePadding.x <= frame_bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
        RenderTextClipped(frame_bb.Min + style.FramePadding, ImVec2(value_x2, frame_bb.Max.y), preview_value, NULL, NULL, ImVec2(0.0f,0.0f));
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (has_window_size_constraint)
    {
        g.NextWindowData.Flags |= ImGuiNextWindowDataFlags_HasSizeConstraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Peak into expected window size so we can position it
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            ImVec2 size_expected = CalcWindowExpectedSize(popup_window);
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left;
            ImRect r_outer = GetWindowAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // We don't use BeginPopupEx() solely because we have a custom name string, which we could make an argument to BeginPopupEx()
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoMove;

    // Horizontally align ourselves with the framed text
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}